

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O2

Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&> *
__thiscall
testing::PolymorphicMatcher::operator_cast_to_Matcher
          (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
           *__return_storage_ptr__,PolymorphicMatcher *this)

{
  MonomorphicImpl<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  *this_00;
  
  this_00 = (MonomorphicImpl<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
             *)operator_new(0x28);
  PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::
  MonomorphicImpl<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::MonomorphicImpl(this_00,(HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)this);
  (__return_storage_ptr__->
  super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ).impl_.value_ =
       (MatcherInterface<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
        *)this_00;
  (__return_storage_ptr__->
  super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ).impl_.link_.next_ =
       &(__return_storage_ptr__->
        super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
        ).impl_.link_;
  (__return_storage_ptr__->
  super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  )._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_00163280;
  return __return_storage_ptr__;
}

Assistant:

operator Matcher<T>() const {
    return Matcher<T>(new MonomorphicImpl<T>(impl_));
  }